

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

_Bool unshield_file_save_old(Unshield *unshield,int index,char *filename)

{
  size_t sVar1;
  uint uVar2;
  _Bool _Var3;
  longlong lVar4;
  char *pcVar5;
  uint8_t *puVar6;
  size_t sVar7;
  bool bVar8;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar9;
  uint local_cc;
  uint8_t *match;
  size_t chunk_size;
  uint8_t *chunk_buffer;
  size_t input_size;
  uLong read_bytes;
  ulong uStack_70;
  int result;
  uLong bytes_to_write;
  FileDescriptor *file_descriptor;
  UnshieldReader *reader;
  uLong total_written;
  Byte *pBStack_48;
  uint bytes_left;
  uchar *output_buffer;
  uchar *input_buffer;
  size_t input_buffer_size;
  FILE *output;
  char *pcStack_20;
  _Bool success;
  char *filename_local;
  Unshield *pUStack_10;
  int index_local;
  Unshield *unshield_local;
  
  output._7_1_ = 0;
  input_buffer_size = 0;
  input_buffer = (uchar *)0x10000;
  pcStack_20 = filename;
  filename_local._4_4_ = index;
  pUStack_10 = unshield;
  output_buffer = (uchar *)malloc(0x10000);
  pBStack_48 = (Byte *)malloc(0x10000);
  reader = (UnshieldReader *)0x0;
  file_descriptor = (FileDescriptor *)0x0;
  if (pUStack_10 != (Unshield *)0x0) {
    bytes_to_write = (uLong)unshield_get_file_descriptor(pUStack_10,filename_local._4_4_);
    if ((FileDescriptor *)bytes_to_write == (FileDescriptor *)0x0) {
      _unshield_log(1,"unshield_file_save_old",0x441,"Failed to get file descriptor for file %i",
                    (ulong)filename_local._4_4_);
    }
    else if (((((FileDescriptor *)bytes_to_write)->flags & 8) == 0) &&
            (((FileDescriptor *)bytes_to_write)->data_offset != 0)) {
      if ((((FileDescriptor *)bytes_to_write)->link_flags & 1) == 0) {
        file_descriptor =
             (FileDescriptor *)
             unshield_reader_create
                       (pUStack_10,filename_local._4_4_,(FileDescriptor *)bytes_to_write);
        if ((UnshieldReader *)file_descriptor == (UnshieldReader *)0x0) {
          _unshield_log(1,"unshield_file_save_old",0x454,"Failed to create data reader for file %i",
                        (ulong)filename_local._4_4_);
        }
        else {
          lVar4 = unshield_fsize(pUStack_10,((UnshieldReader *)file_descriptor)->volume_file);
          if (lVar4 == *(long *)(bytes_to_write + 0x20)) {
            _unshield_log(1,"unshield_file_save_old",0x45a,
                          "File %i is not inside the cabinet. Trying external file!",
                          (ulong)filename_local._4_4_);
            unshield_reader_destroy((UnshieldReader *)file_descriptor);
            file_descriptor =
                 (FileDescriptor *)
                 unshield_reader_create_external
                           (pUStack_10,filename_local._4_4_,(FileDescriptor *)bytes_to_write);
            if ((UnshieldReader *)file_descriptor == (UnshieldReader *)0x0) {
              _unshield_log(1,"unshield_file_save_old",0x45f,
                            "Failed to create data reader for file %i",(ulong)filename_local._4_4_);
              goto LAB_00104b6c;
            }
          }
          if ((pcStack_20 == (char *)0x0) ||
             (input_buffer_size = (size_t)unshield_fopen(pUStack_10,pcStack_20,"wb"),
             (void *)input_buffer_size != (void *)0x0)) {
            total_written._4_4_ = (uint)*(undefined8 *)(bytes_to_write + 0x10);
            while (total_written._4_4_ != 0) {
              uStack_70 = 0;
              if (((int)file_descriptor[1].data_offset == 0) &&
                 (_Var3 = unshield_reader_open_volume
                                    ((UnshieldReader *)file_descriptor,
                                     (int)file_descriptor->compressed_size + 1), !_Var3)) {
                _unshield_log(1,"unshield_file_save_old",0x47c,
                              "Failed to open volume %i to read %i more bytes",
                              (ulong)((int)file_descriptor->compressed_size + 1),
                              (ulong)total_written._4_4_);
                goto LAB_00104b6c;
              }
              if ((*(ushort *)(bytes_to_write + 8) & 4) == 0) {
                if (total_written._4_4_ < 0x10000) {
                  local_cc = total_written._4_4_;
                }
                else {
                  local_cc = 0x10000;
                }
                uStack_70 = (ulong)local_cc;
                _Var3 = unshield_reader_read((UnshieldReader *)file_descriptor,pBStack_48,uStack_70)
                ;
                sVar1 = uStack_70;
                if (!_Var3) {
                  _unshield_log(1,"unshield_file_save_old",0x4f2,
                                "Failed to read %i bytes from input cabinet file %i",uStack_70,
                                (ulong)*(ushort *)(bytes_to_write + 0x38));
                  goto LAB_00104b6c;
                }
                total_written._4_4_ = total_written._4_4_ - (int)uStack_70;
                if ((input_buffer_size != 0) &&
                   (sVar7 = unshield_fwrite(pUStack_10,pBStack_48,1,uStack_70,
                                            (void *)input_buffer_size), sVar1 != sVar7)) {
                  _unshield_log(1,"unshield_file_save_old",0x4fc,
                                "Failed to write %i bytes to file \'%s\'",uStack_70,pcStack_20);
                  goto LAB_00104b6c;
                }
                reader = (UnshieldReader *)((long)&reader->unshield + uStack_70);
              }
              else {
                chunk_buffer = (uint8_t *)(ulong)(uint)file_descriptor[1].data_offset;
                while (input_buffer < chunk_buffer) {
                  input_buffer = (uchar *)((long)input_buffer << 1);
                  _unshield_log(3,"unshield_file_save_old",0x48a,
                                "increased input_buffer_size to 0x%x",input_buffer);
                  output_buffer = (uchar *)realloc(output_buffer,(size_t)input_buffer);
                  if (output_buffer == (uchar *)0x0) {
                    __assert_fail("input_buffer",
                                  "/workspace/llm4binary/github/license_c_cmakelists/twogood[P]unshield/lib/file.c"
                                  ,0x48e,
                                  "_Bool unshield_file_save_old(Unshield *, int, const char *)");
                  }
                }
                _Var3 = unshield_reader_read
                                  ((UnshieldReader *)file_descriptor,output_buffer,
                                   (size_t)chunk_buffer);
                uVar2 = filename_local._4_4_;
                if (!_Var3) {
                  pcVar5 = unshield_file_name(pUStack_10,filename_local._4_4_);
                  _unshield_log(1,"unshield_file_save_old",0x495,
                                "Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i"
                                ,chunk_buffer,(ulong)uVar2,pcVar5,
                                (uint)*(ushort *)(bytes_to_write + 0x38));
                  goto LAB_00104b6c;
                }
                chunk_size = (size_t)output_buffer;
                while (chunk_buffer != (uint8_t *)0x0 && total_written._4_4_ != 0) {
                  puVar6 = find_bytes((uint8_t *)chunk_size,(size_t)chunk_buffer,"",4);
                  uVar2 = filename_local._4_4_;
                  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                  if (puVar6 == (uint8_t *)0x0) {
                    pcVar5 = unshield_file_name(pUStack_10,filename_local._4_4_);
                    _unshield_log(1,"unshield_file_save_old",0x4a1,
                                  "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                  ,(ulong)uVar2,pcVar5,
                                  CONCAT44(uVar9,(uint)*(ushort *)(bytes_to_write + 0x38)));
                    goto LAB_00104b6c;
                  }
                  match = puVar6 + -chunk_size;
                  while( true ) {
                    bVar8 = false;
                    if (match + 4 < chunk_buffer) {
                      bVar8 = (match[chunk_size + 4] & 1) != 0;
                    }
                    if (!bVar8) break;
                    _unshield_log(2,"unshield_file_save_old",0x4b6,
                                  "It seems like we have an end of chunk marker inside of a chunk.")
                    ;
                    puVar6 = find_bytes(match + 4 + chunk_size,
                                        (long)chunk_buffer - (long)(match + 4),"",4);
                    uVar2 = filename_local._4_4_;
                    uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                    if (puVar6 == (uint8_t *)0x0) {
                      pcVar5 = unshield_file_name(pUStack_10,filename_local._4_4_);
                      _unshield_log(1,"unshield_file_save_old",0x4bc,
                                    "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                    ,(ulong)uVar2,pcVar5,
                                    CONCAT44(uVar9,(uint)*(ushort *)(bytes_to_write + 0x38)));
                      goto LAB_00104b6c;
                    }
                    match = puVar6 + -chunk_size;
                  }
                  _unshield_log(3,"unshield_file_save_old",0x4c3,"chunk_size = 0x%x",match);
                  match[chunk_size] = '\0';
                  uStack_70 = 0x10000;
                  input_size = (size_t)match;
                  read_bytes._4_4_ =
                       unshield_uncompress_old
                                 (pBStack_48,&stack0xffffffffffffff90,(Byte *)chunk_size,&input_size
                                 );
                  if (read_bytes._4_4_ != 0) {
                    _unshield_log(1,"unshield_file_save_old",0x4d0,
                                  "Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i"
                                  ,(ulong)read_bytes._4_4_,chunk_buffer,
                                  CONCAT44((int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                           (int)file_descriptor[1].data_offset),
                                  (uint)*(ushort *)(bytes_to_write + 0x38),input_size);
                    goto LAB_00104b6c;
                  }
                  _unshield_log(3,"unshield_file_save_old",0x4d5,"read_bytes = 0x%x",input_size);
                  sVar1 = uStack_70;
                  chunk_size = (size_t)(match + chunk_size + 4);
                  chunk_buffer = chunk_buffer + (-4 - (long)match);
                  total_written._4_4_ = total_written._4_4_ - (int)uStack_70;
                  if ((input_buffer_size != 0) &&
                     (sVar7 = unshield_fwrite(pUStack_10,pBStack_48,1,uStack_70,
                                              (void *)input_buffer_size), sVar1 != sVar7)) {
                    _unshield_log(1,"unshield_file_save_old",0x4e2,
                                  "Failed to write %i bytes to file \'%s\'",uStack_70,pcStack_20);
                    goto LAB_00104b6c;
                  }
                  reader = (UnshieldReader *)((long)&reader->unshield + uStack_70);
                }
              }
            }
            if (*(UnshieldReader **)(bytes_to_write + 0x10) == reader) {
              output._7_1_ = 1;
            }
            else {
              _unshield_log(1,"unshield_file_save_old",0x509,
                            "Expanded size expected to be %i, but was %i",
                            *(undefined8 *)(bytes_to_write + 0x10),reader);
            }
          }
          else {
            _unshield_log(1,"unshield_file_save_old",0x469,"Failed to open output file \'%s\'",
                          pcStack_20);
          }
        }
      }
      else {
        output._7_1_ = unshield_file_save_old
                                 (pUStack_10,((FileDescriptor *)bytes_to_write)->link_previous,
                                  pcStack_20);
      }
    }
  }
LAB_00104b6c:
  unshield_reader_destroy((UnshieldReader *)file_descriptor);
  if (input_buffer_size != 0) {
    unshield_fclose(pUStack_10,(void *)input_buffer_size);
    input_buffer_size = 0;
  }
  if (output_buffer != (uchar *)0x0) {
    free(output_buffer);
    output_buffer = (uchar *)0x0;
  }
  if (pBStack_48 != (Byte *)0x0) {
    free(pBStack_48);
  }
  return (_Bool)(output._7_1_ & 1);
}

Assistant:

bool unshield_file_save_old(Unshield* unshield, int index, const char* filename)/*{{{*/
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  size_t input_buffer_size = BUFFER_SIZE;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  uLong total_written = 0;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_old(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
      unshield_error("File %i is not inside the cabinet. Trying external file!", index);
      unshield_reader_destroy(reader);
      reader = unshield_reader_create_external(unshield, index, file_descriptor);
      if (!reader)
      {
          unshield_error("Failed to create data reader for file %i", index);
          goto exit;
      }
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

    bytes_left = file_descriptor->expanded_size;

#if VERBOSE >= 4
  unshield_trace("Bytes to write: %i", bytes_left);
#endif

  while (bytes_left > 0)
  {
    uLong bytes_to_write = 0;
    int result;

    if (reader->volume_bytes_left == 0 && !unshield_reader_open_volume(reader, reader->volume + 1))
    {
      unshield_error("Failed to open volume %i to read %i more bytes",
                     reader->volume + 1, bytes_left);
      goto exit;
    }

    if (file_descriptor->flags & FILE_COMPRESSED)
    {
      uLong read_bytes;
      size_t input_size = reader->volume_bytes_left;
      uint8_t* chunk_buffer;

      while (input_size > input_buffer_size) 
      {
        input_buffer_size *= 2;
#if VERBOSE >= 3
        unshield_trace("increased input_buffer_size to 0x%x", input_buffer_size);
#endif

        input_buffer = realloc(input_buffer, input_buffer_size);
        assert(input_buffer);
      }

      if (!unshield_reader_read(reader, input_buffer, input_size))
      {
#if VERBOSE
        unshield_error("Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i", 
            input_size, index, unshield_file_name(unshield, index), file_descriptor->volume);
#endif
        goto exit;
      }

      for (chunk_buffer = input_buffer; input_size && bytes_left; )
      {
        size_t chunk_size;
        uint8_t* match = find_bytes(chunk_buffer, input_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
        if (!match)
        {
          unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
              index, unshield_file_name(unshield, index), file_descriptor->volume);
          goto exit;
        }

        chunk_size = match - chunk_buffer;

        /*
           Detect when the chunk actually contains the end of chunk marker.

           Needed by Qtime.smk from "The Feeble Files - spanish version".

           The first bit of a compressed block is always zero, so we apply this
           workaround if it's a one.

           A possibly more proper fix for this would be to have
           unshield_uncompress_old eat compressed data and discard chunk
           markers inbetween.
           */
        while ((chunk_size + sizeof(END_OF_CHUNK)) < input_size &&
            chunk_buffer[chunk_size + sizeof(END_OF_CHUNK)] & 1)
        {
          unshield_warning("It seems like we have an end of chunk marker inside of a chunk.");
          chunk_size += sizeof(END_OF_CHUNK);
          match = find_bytes(chunk_buffer + chunk_size, input_size - chunk_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
          if (!match)
          {
            unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
                index, unshield_file_name(unshield, index), file_descriptor->volume);
            goto exit;
          }
          chunk_size = match - chunk_buffer;
        }

#if VERBOSE >= 3
        unshield_trace("chunk_size = 0x%x", chunk_size);
#endif

        /* add a null byte to make inflate happy */
        chunk_buffer[chunk_size] = 0;

        bytes_to_write = BUFFER_SIZE;
        read_bytes = chunk_size;
        result = unshield_uncompress_old(output_buffer, &bytes_to_write, chunk_buffer, &read_bytes);

        if (Z_OK != result)
        {
          unshield_error("Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i",
              result, input_size, reader->volume_bytes_left, file_descriptor->volume, read_bytes);
          goto exit;
        }

#if VERBOSE >= 3
        unshield_trace("read_bytes = 0x%x", read_bytes);
#endif

        chunk_buffer += chunk_size;
        chunk_buffer += sizeof(END_OF_CHUNK);

        input_size -= chunk_size;
        input_size -= sizeof(END_OF_CHUNK);

          bytes_left -= bytes_to_write;

          if (output) {
              if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
                  unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
                  goto exit;
              }
          }

        total_written += bytes_to_write;
      }
    }
    else
    {
      bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

      if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
      {
#if VERBOSE
        unshield_error("Failed to read %i bytes from input cabinet file %i", 
            bytes_to_write, file_descriptor->volume);
#endif
        goto exit;
      }

      bytes_left -= bytes_to_write;

      if (output) {
        if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output))
        {
          unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
          goto exit;
        }
      }

      total_written += bytes_to_write;

    }
  }

  if (file_descriptor->expanded_size != total_written)
  {
    unshield_error("Expanded size expected to be %i, but was %i", 
        file_descriptor->expanded_size, total_written);
    goto exit;
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}